

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_1::uploadTexture
               (CallLogWrapper *glLog,LayeredImage *src,deUint32 textureBufGL)

{
  TextureType texType;
  GLsizei GVar1;
  GLsizei GVar2;
  int iVar3;
  GLsizei depth;
  GLint param;
  deUint32 dVar4;
  uint uVar5;
  int iVar6;
  TransferFormat TVar7;
  int faceI;
  CubeFace face;
  GLenum format;
  GLenum type;
  ConstPixelBufferAccess local_58;
  
  dVar4 = glu::getInternalFormat(src->m_format);
  TVar7 = glu::getTransferFormat(src->m_format);
  setTextureStorage(glLog,src->m_type,dVar4,&src->m_size,textureBufGL);
  uVar5 = tcu::TextureFormat::getPixelSize(&src->m_format);
  param = 8;
  if ((uVar5 & uVar5 - 1) != 0) {
    param = 1;
  }
  glu::CallLogWrapper::glPixelStorei(glLog,0xcf5,param);
  texType = src->m_type;
  format = TVar7.format;
  type = TVar7.dataType;
  if (texType == TEXTURETYPE_2D) {
    GVar1 = (src->m_size).m_data[0];
    GVar2 = (src->m_size).m_data[1];
    LayeredImage::getAccess(&local_58,src);
    glu::CallLogWrapper::glTexSubImage2D(glLog,0xde1,0,0,0,GVar1,GVar2,format,type,local_58.m_data);
  }
  else if (texType == TEXTURETYPE_BUFFER) {
    glu::CallLogWrapper::glBindBuffer(glLog,0x8c2a,textureBufGL);
    iVar6 = tcu::TextureFormat::getPixelSize(&src->m_format);
    iVar3 = (src->m_size).m_data[0];
    LayeredImage::getAccess(&local_58,src);
    glu::CallLogWrapper::glBufferData(glLog,0x8c2a,(long)(iVar6 * iVar3),local_58.m_data,0x88e4);
  }
  else if (texType == TEXTURETYPE_CUBE) {
    for (face = CUBEFACE_NEGATIVE_X; face != CUBEFACE_LAST; face = face + CUBEFACE_POSITIVE_X) {
      dVar4 = cubeFaceToGLFace(face);
      GVar1 = (src->m_size).m_data[0];
      GVar2 = (src->m_size).m_data[1];
      LayeredImage::getCubeFaceAccess(&local_58,src,face);
      glu::CallLogWrapper::glTexSubImage2D
                (glLog,dVar4,0,0,0,GVar1,GVar2,format,type,local_58.m_data);
    }
  }
  else {
    dVar4 = getGLTextureTarget(texType);
    GVar1 = (src->m_size).m_data[0];
    GVar2 = (src->m_size).m_data[1];
    depth = (src->m_size).m_data[2];
    LayeredImage::getAccess(&local_58,src);
    glu::CallLogWrapper::glTexSubImage3D
              (glLog,dVar4,0,0,0,0,GVar1,GVar2,depth,format,type,local_58.m_data);
  }
  return;
}

Assistant:

static void uploadTexture (glu::CallLogWrapper& glLog, const LayeredImage& src, deUint32 textureBufGL)
{
	const deUint32				internalFormat	= glu::getInternalFormat(src.getFormat());
	const glu::TransferFormat	transferFormat	= glu::getTransferFormat(src.getFormat());
	const IVec3&				imageSize		= src.getSize();

	setTextureStorage(glLog, src.getImageType(), internalFormat, imageSize, textureBufGL);

	{
		const int	pixelSize = src.getFormat().getPixelSize();
		int			unpackAlignment;

		if (deIsPowerOfTwo32(pixelSize))
			unpackAlignment = 8;
		else
			unpackAlignment = 1;

		glLog.glPixelStorei(GL_UNPACK_ALIGNMENT, unpackAlignment);
	}

	if (src.getImageType() == TEXTURETYPE_BUFFER)
	{
		glLog.glBindBuffer(GL_TEXTURE_BUFFER, textureBufGL);
		glLog.glBufferData(GL_TEXTURE_BUFFER, src.getFormat().getPixelSize() * imageSize.x(), src.getAccess().getDataPtr(), GL_STATIC_DRAW);
	}
	else if (src.getImageType() == TEXTURETYPE_2D)
		glLog.glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, imageSize.x(), imageSize.y(), transferFormat.format, transferFormat.dataType, src.getAccess().getDataPtr());
	else if (src.getImageType() == TEXTURETYPE_CUBE)
	{
		for (int faceI = 0; faceI < tcu::CUBEFACE_LAST; faceI++)
		{
			const tcu::CubeFace face = (tcu::CubeFace)faceI;
			glLog.glTexSubImage2D(cubeFaceToGLFace(face), 0, 0, 0, imageSize.x(), imageSize.y(), transferFormat.format, transferFormat.dataType, src.getCubeFaceAccess(face).getDataPtr());
		}
	}
	else
	{
		DE_ASSERT(src.getImageType() == TEXTURETYPE_3D || src.getImageType() == TEXTURETYPE_2D_ARRAY);
		const deUint32 textureTarget = getGLTextureTarget(src.getImageType());
		glLog.glTexSubImage3D(textureTarget, 0, 0, 0, 0, imageSize.x(), imageSize.y(), imageSize.z(), transferFormat.format, transferFormat.dataType, src.getAccess().getDataPtr());
	}
}